

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

void lzma_end(lzma_stream *strm)

{
  if ((strm != (lzma_stream *)0x0) && (strm->internal != (lzma_internal *)0x0)) {
    lzma_next_end(&strm->internal->next,strm->allocator);
    lzma_free(strm->internal,strm->allocator);
    strm->internal = (lzma_internal *)0x0;
  }
  return;
}

Assistant:

extern LZMA_API(void)
lzma_end(lzma_stream *strm)
{
	if (strm != NULL && strm->internal != NULL) {
		lzma_next_end(&strm->internal->next, strm->allocator);
		lzma_free(strm->internal, strm->allocator);
		strm->internal = NULL;
	}

	return;
}